

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexeme_Constant.cpp
# Opt level: O2

EncodingPrefix __thiscall psy::C::CharacterConstant::encodingPrefix(CharacterConstant *this)

{
  ushort uVar1;
  EncodingPrefix EVar2;
  
  uVar1 = (this->super_Lexeme).field_0.BD_;
  EVar2 = L;
  if ((uVar1 & 0x40) == 0) {
    if ((char)uVar1 < '\0') {
      return u;
    }
    EVar2 = ((uVar1 >> 9 & 1) == 0) * '\x02' + U;
  }
  return EVar2;
}

Assistant:

CharacterConstant::EncodingPrefix CharacterConstant::encodingPrefix() const
{
    if (F_.L_)
        return EncodingPrefix::L;
    if (F_.u_)
        return EncodingPrefix::u;
    if (F_.U_)
        return EncodingPrefix::U;
    return EncodingPrefix::None;
}